

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::pop_context(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,regex_impl *impl,bool success)

{
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar3;
  matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar4;
  traits<char> *ptVar5;
  undefined3 in_register_00000011;
  
  pmVar1 = (this->context_).prev_context_;
  if (CONCAT31(in_register_00000011,success) == 0) {
    pmVar2 = pmVar1->results_ptr_;
    sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unwind_to(&this->extras_->sub_match_stack_,this->sub_matches_ + -impl->hidden_mark_count_);
    results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reclaim_last(&this->extras_->results_cache_,&pmVar2->nested_results_);
  }
  pmVar3 = pmVar1->prev_context_;
  pmVar4 = pmVar1->next_ptr_;
  ptVar5 = pmVar1->traits_;
  (this->context_).results_ptr_ = pmVar1->results_ptr_;
  (this->context_).prev_context_ = pmVar3;
  (this->context_).next_ptr_ = pmVar4;
  (this->context_).traits_ = ptVar5;
  pmVar2 = (this->context_).results_ptr_;
  this->sub_matches_ = (pmVar2->sub_matches_).sub_matches_;
  this->mark_count_ = (pmVar2->sub_matches_).size_;
  return success;
}

Assistant:

bool pop_context(regex_impl const &impl, bool success)
    {
        match_context &context = *this->context_.prev_context_;
        if(!success)
        {
            match_results &what = *context.results_ptr_;
            this->uninit_(impl, what);

            // send the match_results struct back to the cache
            nested_results<BidiIter> &nested = access::get_nested_results(what);
            this->extras_->results_cache_.reclaim_last(nested);
        }

        // restore the state
        this->context_ = context;
        match_results &results = *this->context_.results_ptr_;
        this->sub_matches_ = access::get_sub_matches(access::get_sub_match_vector(results));
        this->mark_count_ = results.size();
        return success;
    }